

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::XMLScanner::getURIText(XMLScanner *this,uint uriId,XMLBuffer *uriBufToFill)

{
  int iVar1;
  XMLCh *chars;
  undefined4 extraout_var;
  
  iVar1 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[7])();
  if ((char)iVar1 != '\0') {
    iVar1 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[10])
                      (this->fURIStringPool,uriId);
    chars = (XMLCh *)CONCAT44(extraout_var,iVar1);
    if (chars != (XMLCh *)0x0) {
      uriBufToFill->fIndex = 0;
      if (*chars == L'\0') {
        return true;
      }
      XMLBuffer::append(uriBufToFill,chars);
      return true;
    }
  }
  return false;
}

Assistant:

bool XMLScanner::getURIText(  const   unsigned int    uriId
                      ,       XMLBuffer&      uriBufToFill) const
{
    if (fURIStringPool->exists(uriId)) {
        // Look up the URI in the string pool and return its id
        const XMLCh* value = fURIStringPool->getValueForId(uriId);
        if (!value)
            return false;

        uriBufToFill.set(value);
        return true;
    }
    else
        return false;
}